

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  int iVar1;
  int iVar2;
  int olderrs;
  int res;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  iVar1 = pctxt->nberrors;
  if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
    return -1;
  }
  if ((type->type == XML_SCHEMA_TYPE_BASIC) || ((type->flags & 0x400000U) != 0)) {
    return 0;
  }
  type->flags = type->flags | 0x400000;
  type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
  if (type->baseType == (xmlSchemaTypePtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupSimpleTypeStageTwo","missing baseType"
              );
  }
  else {
    if ((type->baseType->type != XML_SCHEMA_TYPE_BASIC) &&
       ((type->baseType->flags & 0x400000U) == 0)) {
      xmlSchemaTypeFixup(type->baseType,(xmlSchemaAbstractCtxtPtr)pctxt);
    }
    if ((type->memberTypes != (xmlSchemaTypeLinkPtr)0x0) &&
       (iVar2 = xmlSchemaFinishMemberTypeDefinitionsProperty(pctxt,type), iVar2 == -1)) {
      return -1;
    }
    iVar2 = xmlSchemaCheckSTPropsCorrect(pctxt,type);
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        iVar2 = xmlSchemaCheckCOSSTRestricts(pctxt,type);
        if (iVar2 == -1) {
          return -1;
        }
        if (iVar2 == 0) {
          iVar2 = xmlSchemaCheckFacetValues(type,pctxt);
          if (iVar2 == -1) {
            return -1;
          }
          if (iVar2 == 0) {
            if ((type->facetSet != (xmlSchemaFacetLinkPtr)0x0) ||
               (type->baseType->facetSet != (xmlSchemaFacetLinkPtr)0x0)) {
              iVar2 = xmlSchemaDeriveAndValidateFacets(pctxt,type);
              if (iVar2 == -1) {
                return -1;
              }
              if (iVar2 != 0) goto LAB_002199fc;
            }
            iVar2 = xmlSchemaTypeFixupWhitespace(type);
            if (iVar2 == -1) {
              return -1;
            }
            if (iVar2 == 0) {
              xmlSchemaTypeFixupOptimFacets(type);
            }
          }
        }
      }
LAB_002199fc:
      if (iVar1 == pctxt->nberrors) {
        return 0;
      }
      return pctxt->err;
    }
  }
  return -1;
}

Assistant:

static int
xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    int res, olderrs = pctxt->nberrors;

    if (type->type != XML_SCHEMA_TYPE_SIMPLE)
	return(-1);

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);

    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    type->contentType = XML_SCHEMA_CONTENT_SIMPLE;

    if (type->baseType == NULL) {
	PERROR_INT("xmlSchemaFixupSimpleTypeStageTwo",
	    "missing baseType");
	goto exit_failure;
    }
    if (WXS_IS_TYPE_NOT_FIXED(type->baseType))
	xmlSchemaTypeFixup(type->baseType, ACTXT_CAST pctxt);
    /*
    * If a member type of a union is a union itself, we need to substitute
    * that member type for its member types.
    * NOTE that this might change in WXS 1.1; i.e. we will keep the union
    * types in WXS 1.1.
    */
    if ((type->memberTypes != NULL) &&
	(xmlSchemaFinishMemberTypeDefinitionsProperty(pctxt, type) == -1))
	return(-1);
    /*
    * SPEC src-simple-type 1
    * "The corresponding simple type definition, if any, must satisfy
    * the conditions set out in Constraints on Simple Type Definition
    * Schema Components ($3.14.6)."
    */
    /*
    * Schema Component Constraint: Simple Type Definition Properties Correct
    * (st-props-correct)
    */
    res = xmlSchemaCheckSTPropsCorrect(pctxt, type);
    HFAILURE HERROR
    /*
    * Schema Component Constraint: Derivation Valid (Restriction, Simple)
    * (cos-st-restricts)
    */
    res = xmlSchemaCheckCOSSTRestricts(pctxt, type);
    HFAILURE HERROR
    /*
    * TODO: Removed the error report, since it got annoying to get an
    * extra error report, if anything failed until now.
    * Enable this if needed.
    *
    * xmlSchemaPErr(ctxt, type->node,
    *    XML_SCHEMAP_SRC_SIMPLE_TYPE_1,
    *    "Simple type '%s' does not satisfy the constraints "
    *    "on simple type definitions.\n",
    *    type->name, NULL);
    */
    /*
    * Schema Component Constraint: Simple Type Restriction (Facets)
    * (st-restrict-facets)
    */
    res = xmlSchemaCheckFacetValues(type, pctxt);
    HFAILURE HERROR
    if ((type->facetSet != NULL) ||
	(type->baseType->facetSet != NULL)) {
	res = xmlSchemaDeriveAndValidateFacets(pctxt, type);
	HFAILURE HERROR
    }
    /*
    * Whitespace value.
    */
    res = xmlSchemaTypeFixupWhitespace(type);
    HFAILURE HERROR
    xmlSchemaTypeFixupOptimFacets(type);

exit_error:
#ifdef DEBUG_TYPE
    xmlSchemaDebugFixedType(pctxt, type);
#endif
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);

exit_failure:
#ifdef DEBUG_TYPE
    xmlSchemaDebugFixedType(pctxt, type);
#endif
    return(-1);
}